

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestStart(StreamingListener *this,TestInfo *test_info)

{
  char *__rhs;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  TestInfo *local_18;
  TestInfo *test_info_local;
  StreamingListener *this_local;
  
  local_18 = test_info;
  test_info_local = (TestInfo *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"event=TestStart&name=",&local_59);
  __rhs = TestInfo::name(local_18);
  std::operator+(&local_38,&local_58,__rhs);
  SendLn(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

void OnTestStart(const TestInfo& test_info) {
    SendLn(std::string("event=TestStart&name=") + test_info.name());
  }